

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.h
# Opt level: O0

void __thiscall mkvparser::MasteringMetadata::~MasteringMetadata(MasteringMetadata *this)

{
  PrimaryChromaticity *pPVar1;
  MasteringMetadata *this_local;
  
  pPVar1 = this->r;
  if (pPVar1 != (PrimaryChromaticity *)0x0) {
    PrimaryChromaticity::~PrimaryChromaticity(pPVar1);
    operator_delete(pPVar1);
  }
  pPVar1 = this->g;
  if (pPVar1 != (PrimaryChromaticity *)0x0) {
    PrimaryChromaticity::~PrimaryChromaticity(pPVar1);
    operator_delete(pPVar1);
  }
  pPVar1 = this->b;
  if (pPVar1 != (PrimaryChromaticity *)0x0) {
    PrimaryChromaticity::~PrimaryChromaticity(pPVar1);
    operator_delete(pPVar1);
  }
  pPVar1 = this->white_point;
  if (pPVar1 != (PrimaryChromaticity *)0x0) {
    PrimaryChromaticity::~PrimaryChromaticity(pPVar1);
    operator_delete(pPVar1);
  }
  return;
}

Assistant:

~MasteringMetadata() {
    delete r;
    delete g;
    delete b;
    delete white_point;
  }